

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O3

void __thiscall
ExprTest_HashCallExpr_Test::~ExprTest_HashCallExpr_Test(ExprTest_HashCallExpr_Test *this)

{
  (this->super_ExprTest).super_Test._vptr_Test = (_func_int **)&PTR__ExprTest_001a4a58;
  mp::BasicExprFactory<std::allocator<char>_>::~BasicExprFactory(&(this->super_ExprTest).factory_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x58);
  return;
}

Assistant:

TEST_F(ExprTest, HashCallExpr) {
  mp::Reference var = MakeVariable(9);
  mp::NumericExpr n1 = MakeConst(1);
  Expr args[2] = {n1, var};
  mp::Function f = factory_.AddFunction("foo", 2, mp::func::SYMBOLIC);
  size_t hash = HashCombine<int>(0, expr::CALL);
  hash = HashCombine(hash, f.name());
  hash = HashCombine<Expr>(hash, n1);
  hash = HashCombine<Expr>(hash, var);
  EXPECT_EQ(hash, ExprHash()(MakeCall(f, args)));
}